

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O1

uint cppwinrt::get_integer_attribute<unsigned_int>(FixedArgSig *signature)

{
  variant_alternative_t<0UL,_variant<ElemSig,_vector<ElemSig,_allocator<ElemSig>_>_>_> *pvVar1;
  uint *puVar2;
  value_type variant;
  _Variadic_union<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
  local_38;
  undefined8 uStack_10;
  
  pvVar1 = std::
           get<0ul,winmd::reader::ElemSig,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>>
                     (&signature->value);
  local_38._0_8_ =
       *(undefined8 *)
        &(pvVar1->value).
         super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
         .
         super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
         .
         super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
         .
         super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
         .
         super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
         .
         super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
  ;
  local_38._8_8_ =
       *(undefined8 *)
        ((long)&(pvVar1->value).
                super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
        + 8);
  local_38._16_8_ =
       *(undefined8 *)
        ((long)&(pvVar1->value).
                super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
        + 0x10);
  local_38._24_8_ =
       *(undefined8 *)
        ((long)&(pvVar1->value).
                super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
        + 0x18);
  local_38._32_8_ =
       *(undefined8 *)
        ((long)&(pvVar1->value).
                super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
        + 0x20);
  uStack_10 = *(undefined8 *)
               ((long)&(pvVar1->value).
                       super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                       .
                       super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                       .
                       super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                       .
                       super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                       .
                       super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                       .
                       super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
               + 0x28);
  if ((char)uStack_10 == '\a') {
    puVar2 = (uint *)std::
                     get<7ul,bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long,float,double,std::basic_string_view<char,std::char_traits<char>>,winmd::reader::ElemSig::SystemType,winmd::reader::ElemSig::EnumValue>
                               ((variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                                 *)&local_38._M_first);
  }
  else {
    puVar2 = std::
             get<6ul,bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long,float,double,std::basic_string_view<char,std::char_traits<char>>,winmd::reader::ElemSig::SystemType,winmd::reader::ElemSig::EnumValue>
                       ((variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                         *)&local_38._M_first);
  }
  return *puVar2;
}

Assistant:

auto get_integer_attribute(FixedArgSig const& signature)
    {
        auto variant = std::get<ElemSig>(signature.value).value;
        switch (variant.index())
        {
        case variant_index_v<decltype(variant), std::make_unsigned_t<T>>: return static_cast<T>(std::get<std::make_unsigned_t<T>>(variant));
        case variant_index_v<decltype(variant), std::make_signed_t<T>>: return static_cast<T>(std::get<std::make_signed_t<T>>(variant));
        default: return std::get<T>(variant); // Likely throws, but that's intentional
        }
    }